

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O2

void icu_63::initLanguageFactories(void)

{
  uint in_EAX;
  UStack *this;
  ICULanguageBreakFactory *this_00;
  size_t in_RSI;
  code *size;
  ulong uStack_18;
  UErrorCode status;
  
  uStack_18 = (ulong)in_EAX;
  this = (UStack *)UMemory::operator_new((UMemory *)0x28,in_RSI);
  if (this == (UStack *)0x0) {
    gLanguageBreakFactories = (UStack *)0x0;
  }
  else {
    size = _deleteFactory;
    UStack::UStack(this,_deleteFactory,(UElementsAreEqual *)0x0,&status);
    gLanguageBreakFactories = this;
    if (status < U_ILLEGAL_ARGUMENT_ERROR) {
      this_00 = (ICULanguageBreakFactory *)UMemory::operator_new((UMemory *)0x10,(size_t)size);
      if (this_00 != (ICULanguageBreakFactory *)0x0) {
        ICULanguageBreakFactory::ICULanguageBreakFactory(this_00,&status);
      }
      UVector::addElement(&gLanguageBreakFactories->super_UVector,this_00,&status);
    }
  }
  ucln_common_registerCleanup_63(UCLN_COMMON_RBBI,rbbi_cleanup);
  return;
}

Assistant:

static void U_CALLCONV initLanguageFactories() {
    UErrorCode status = U_ZERO_ERROR;
    U_ASSERT(gLanguageBreakFactories == NULL);
    gLanguageBreakFactories = new UStack(_deleteFactory, NULL, status);
    if (gLanguageBreakFactories != NULL && U_SUCCESS(status)) {
        ICULanguageBreakFactory *builtIn = new ICULanguageBreakFactory(status);
        gLanguageBreakFactories->push(builtIn, status);
#ifdef U_LOCAL_SERVICE_HOOK
        LanguageBreakFactory *extra = (LanguageBreakFactory *)uprv_svc_hook("languageBreakFactory", &status);
        if (extra != NULL) {
            gLanguageBreakFactories->push(extra, status);
        }
#endif
    }
    ucln_common_registerCleanup(UCLN_COMMON_RBBI, rbbi_cleanup);
}